

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::Begin(char *name,bool *p_open,ImVec2 *size_first_use,float bg_alpha_override,
                 ImGuiWindowFlags flags)

{
  bool bVar1;
  ImVec2 *in_RDX;
  float in_XMM0_Da;
  ImGuiWindowFlags in_stack_00000684;
  bool *in_stack_00000688;
  char *in_stack_00000690;
  
  if ((((in_RDX->x != 0.0) || (NAN(in_RDX->x))) || (in_RDX->y != 0.0)) || (NAN(in_RDX->y))) {
    SetNextWindowSize(in_RDX,4);
  }
  if (0.0 <= in_XMM0_Da) {
    SetNextWindowBgAlpha(in_XMM0_Da);
  }
  bVar1 = Begin(in_stack_00000690,in_stack_00000688,in_stack_00000684);
  return bVar1;
}

Assistant:

bool ImGui::Begin(const char* name, bool* p_open, const ImVec2& size_first_use, float bg_alpha_override, ImGuiWindowFlags flags)
{
    // Old API feature: we could pass the initial window size as a parameter. This was misleading because it only had an effect if the window didn't have data in the .ini file.
    if (size_first_use.x != 0.0f || size_first_use.y != 0.0f)
        SetNextWindowSize(size_first_use, ImGuiCond_FirstUseEver);

    // Old API feature: override the window background alpha with a parameter.
    if (bg_alpha_override >= 0.0f)
        SetNextWindowBgAlpha(bg_alpha_override);

    return Begin(name, p_open, flags);
}